

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

void icu_63::NFRule::makeRules
               (UnicodeString *description,NFRuleSet *owner,NFRule *predecessor,
               RuleBasedNumberFormat *rbnf,NFRuleList *rules,UErrorCode *status)

{
  short sVar1;
  long lVar2;
  uint srcLength;
  uint uVar3;
  NFRule *this;
  uint64_t uVar4;
  NFRule *this_00;
  int32_t iVar5;
  int iVar6;
  size_t size;
  ulong uVar7;
  UnicodeString sbuf;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  this = (NFRule *)UMemory::operator_new((UMemory *)0x70,(size_t)owner);
  if (this == (NFRule *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return;
  }
  NFRule(this,rbnf,description,status);
  UnicodeString::operator=(description,&this->fRuleText);
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  srcLength = UnicodeString::doIndexOf(description,L'[',0,iVar5);
  if (-1 < (int)srcLength) {
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    size = 0x5d;
    uVar3 = UnicodeString::doIndexOf(description,L']',0,iVar5);
    if ((int)srcLength <= (int)uVar3) {
      uVar7 = this->baseValue;
      iVar6 = -7;
      if ((long)uVar7 < 1) {
        iVar6 = (int)uVar7;
      }
      if ((5 < iVar6 + 6U) || ((0x2bU >> (iVar6 + 6U & 0x1f) & 1) == 0)) {
        local_b0.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003febe0;
        local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
        if ((long)uVar7 < 1) {
LAB_00265f6a:
          if (((uint)uVar7 | 2) == 0xfffffffe) goto LAB_00265f74;
LAB_00265fce:
          this_00 = (NFRule *)0x0;
        }
        else {
          size = (size_t)(ushort)this->exponent;
          uVar4 = util64_pow(this->radix,this->exponent);
          if (uVar7 % uVar4 != 0) {
            uVar7 = this->baseValue;
            if ((long)uVar7 < 1) goto LAB_00265f6a;
            goto LAB_00265fce;
          }
LAB_00265f74:
          this_00 = (NFRule *)UMemory::operator_new((UMemory *)0x70,size);
          if (this_00 == (NFRule *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            UnicodeString::~UnicodeString(&local_b0);
            return;
          }
          local_70.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_003febe0;
          local_70.fUnion.fStackFields.fLengthAndFlags = 2;
          NFRule(this_00,rbnf,&local_70,status);
          UnicodeString::~UnicodeString(&local_70);
          lVar2 = this->baseValue;
          if (lVar2 < 0) {
            if ((int)lVar2 == -4) {
              this_00->baseValue = lVar2;
              this->baseValue = -2;
            }
            else if ((int)lVar2 == -2) {
              this_00->baseValue = -3;
            }
          }
          else {
            this_00->baseValue = lVar2;
            if (owner->fIsFractionRuleSet == '\0') {
              this->baseValue = this->baseValue + 1;
            }
          }
          this_00->radix = this->radix;
          this_00->exponent = this->exponent;
          UnicodeString::doAppend(&local_b0,description,0,srcLength);
          sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar6 = (description->fUnion).fFields.fLength;
          }
          else {
            iVar6 = (int)sVar1 >> 5;
          }
          if ((int)(uVar3 + 1) < iVar6) {
            UnicodeString::doAppend(&local_b0,description,uVar3 + 1,iVar6 + ~uVar3);
          }
          extractSubstitutions(this_00,owner,&local_b0,predecessor,status);
        }
        UnicodeString::setTo(&local_b0,description,0,srcLength);
        UnicodeString::doAppend(&local_b0,description,srcLength + 1,~srcLength + uVar3);
        sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (description->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        if ((int)(uVar3 + 1) < iVar6) {
          UnicodeString::doAppend(&local_b0,description,uVar3 + 1,iVar6 + ~uVar3);
        }
        extractSubstitutions(this,owner,&local_b0,predecessor,status);
        if (this_00 != (NFRule *)0x0) {
          if (this_00->baseValue < 0) {
            NFRuleSet::setNonNumericalRule(owner,this_00);
          }
          else {
            NFRuleList::add(rules,this_00);
          }
        }
        UnicodeString::~UnicodeString(&local_b0);
        goto LAB_00265eee;
      }
    }
  }
  extractSubstitutions(this,owner,description,predecessor,status);
LAB_00265eee:
  if (this->baseValue < 0) {
    NFRuleSet::setNonNumericalRule(owner,this);
  }
  else {
    NFRuleList::add(rules,this);
  }
  return;
}

Assistant:

void
NFRule::makeRules(UnicodeString& description,
                  NFRuleSet *owner,
                  const NFRule *predecessor,
                  const RuleBasedNumberFormat *rbnf,
                  NFRuleList& rules,
                  UErrorCode& status)
{
    // we know we're making at least one rule, so go ahead and
    // new it up and initialize its basevalue and divisor
    // (this also strips the rule descriptor, if any, off the
    // descripton string)
    NFRule* rule1 = new NFRule(rbnf, description, status);
    /* test for NULL */
    if (rule1 == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    description = rule1->fRuleText;

    // check the description to see whether there's text enclosed
    // in brackets
    int32_t brack1 = description.indexOf(gLeftBracket);
    int32_t brack2 = brack1 < 0 ? -1 : description.indexOf(gRightBracket);

    // if the description doesn't contain a matched pair of brackets,
    // or if it's of a type that doesn't recognize bracketed text,
    // then leave the description alone, initialize the rule's
    // rule text and substitutions, and return that rule
    if (brack2 < 0 || brack1 > brack2
        || rule1->getType() == kProperFractionRule
        || rule1->getType() == kNegativeNumberRule
        || rule1->getType() == kInfinityRule
        || rule1->getType() == kNaNRule)
    {
        rule1->extractSubstitutions(owner, description, predecessor, status);
    }
    else {
        // if the description does contain a matched pair of brackets,
        // then it's really shorthand for two rules (with one exception)
        NFRule* rule2 = NULL;
        UnicodeString sbuf;

        // we'll actually only split the rule into two rules if its
        // base value is an even multiple of its divisor (or it's one
        // of the special rules)
        if ((rule1->baseValue > 0
            && (rule1->baseValue % util64_pow(rule1->radix, rule1->exponent)) == 0)
            || rule1->getType() == kImproperFractionRule
            || rule1->getType() == kMasterRule) {

            // if it passes that test, new up the second rule.  If the
            // rule set both rules will belong to is a fraction rule
            // set, they both have the same base value; otherwise,
            // increment the original rule's base value ("rule1" actually
            // goes SECOND in the rule set's rule list)
            rule2 = new NFRule(rbnf, UnicodeString(), status);
            /* test for NULL */
            if (rule2 == 0) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            if (rule1->baseValue >= 0) {
                rule2->baseValue = rule1->baseValue;
                if (!owner->isFractionRuleSet()) {
                    ++rule1->baseValue;
                }
            }

            // if the description began with "x.x" and contains bracketed
            // text, it describes both the improper fraction rule and
            // the proper fraction rule
            else if (rule1->getType() == kImproperFractionRule) {
                rule2->setType(kProperFractionRule);
            }

            // if the description began with "x.0" and contains bracketed
            // text, it describes both the master rule and the
            // improper fraction rule
            else if (rule1->getType() == kMasterRule) {
                rule2->baseValue = rule1->baseValue;
                rule1->setType(kImproperFractionRule);
            }

            // both rules have the same radix and exponent (i.e., the
            // same divisor)
            rule2->radix = rule1->radix;
            rule2->exponent = rule1->exponent;

            // rule2's rule text omits the stuff in brackets: initalize
            // its rule text and substitutions accordingly
            sbuf.append(description, 0, brack1);
            if (brack2 + 1 < description.length()) {
                sbuf.append(description, brack2 + 1, description.length() - brack2 - 1);
            }
            rule2->extractSubstitutions(owner, sbuf, predecessor, status);
        }

        // rule1's text includes the text in the brackets but omits
        // the brackets themselves: initialize _its_ rule text and
        // substitutions accordingly
        sbuf.setTo(description, 0, brack1);
        sbuf.append(description, brack1 + 1, brack2 - brack1 - 1);
        if (brack2 + 1 < description.length()) {
            sbuf.append(description, brack2 + 1, description.length() - brack2 - 1);
        }
        rule1->extractSubstitutions(owner, sbuf, predecessor, status);

        // if we only have one rule, return it; if we have two, return
        // a two-element array containing them (notice that rule2 goes
        // BEFORE rule1 in the list: in all cases, rule2 OMITS the
        // material in the brackets and rule1 INCLUDES the material
        // in the brackets)
        if (rule2 != NULL) {
            if (rule2->baseValue >= kNoBase) {
                rules.add(rule2);
            }
            else {
                owner->setNonNumericalRule(rule2);
            }
        }
    }
    if (rule1->baseValue >= kNoBase) {
        rules.add(rule1);
    }
    else {
        owner->setNonNumericalRule(rule1);
    }
}